

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

void QtPrivate::q_relocate_overlap_n_left_move<QLinuxFbDevice::Output*,long_long>
               (Output *first,longlong n,Output *d_first)

{
  Output *pOVar1;
  Output *in_RDX;
  Output *in_RSI;
  Output *in_RDI;
  long in_FS_OFFSET;
  pair<QLinuxFbDevice::Output_*const_&,_QLinuxFbDevice::Output_*const_&> pVar2;
  Output *overlapEnd;
  Output *overlapBegin;
  pair<QLinuxFbDevice::Output_*const_&,_QLinuxFbDevice::Output_*const_&> pair;
  Output *d_last;
  Destructor destroyer;
  Output **in_stack_ffffffffffffffa0;
  Output *this;
  Output **in_stack_ffffffffffffffa8;
  Output *pOVar3;
  Output **local_48;
  Output **local_40;
  Output *this_00;
  Output *pOVar4;
  Output *this_01;
  Output *local_18;
  Output *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (Output *)0xaaaaaaaaaaaaaaaa;
  pOVar4 = (Output *)0xaaaaaaaaaaaaaaaa;
  this_01 = (Output *)0xaaaaaaaaaaaaaaaa;
  local_18 = in_RDX;
  local_10 = in_RDI;
  q_relocate_overlap_n_left_move<QLinuxFbDevice::Output*,long_long>(QLinuxFbDevice::
  Output*,long_long,QLinuxFbDevice::Output*)::Destructor::Destructor(QLinuxFbDevice::Output___
            (&stack0xffffffffffffffd0,&local_18);
  pOVar1 = local_18 + (long)in_RSI;
  pVar2 = std::minmax<QLinuxFbDevice::Output*>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  local_48 = pVar2.first;
  pOVar3 = *local_48;
  local_40 = pVar2.second;
  this = *local_40;
  for (; local_18 != pOVar3; local_18 = local_18 + 1) {
    QLinuxFbDevice::Output::Output(this_01,pOVar4);
    local_10 = local_10 + 1;
  }
  q_relocate_overlap_n_left_move<QLinuxFbDevice::Output_*,_long_long>::Destructor::freeze
            ((Destructor *)&stack0xffffffffffffffd0);
  for (; local_18 != pOVar1; local_18 = local_18 + 1) {
    QLinuxFbDevice::Output::operator=(in_RSI,pOVar3);
    local_10 = local_10 + 1;
  }
  q_relocate_overlap_n_left_move<QLinuxFbDevice::Output_*,_long_long>::Destructor::commit
            ((Destructor *)&stack0xffffffffffffffd0);
  while (local_10 != this) {
    local_10 = local_10 + -1;
    QLinuxFbDevice::Output::~Output(this_00);
  }
  q_relocate_overlap_n_left_move<QLinuxFbDevice::Output_*,_long_long>::Destructor::~Destructor
            ((Destructor *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}